

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

shared_ptr<mnf::Manifold> __thiscall mnf::CartesianProduct::getNewCopy_(CartesianProduct *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  CartesianProduct *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProduct *in_RSI;
  shared_ptr<mnf::Manifold> sVar2;
  shared_ptr<mnf::CartesianProduct> copy;
  _func_int **local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = (CartesianProduct *)operator_new(0xa0);
  CartesianProduct(this_00,in_RSI);
  std::__shared_ptr<mnf::CartesianProduct,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mnf::CartesianProduct,void>
            ((__shared_ptr<mnf::CartesianProduct,(__gnu_cxx::_Lock_policy)2> *)&local_28,this_00);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Manifold)._vptr_Manifold = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Manifold).super_RefCounter =
       _Var1._M_pi;
  local_28 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> CartesianProduct::getNewCopy_() const
{
  std::shared_ptr<CartesianProduct> copy(new CartesianProduct(*this));
  return copy;
}